

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3EvalIncrPhraseNext(Fts3Cursor *pCsr,Fts3Phrase *p,u8 *pbEof)

{
  Fts3Table *pTab_00;
  int iVar1;
  bool bVar2;
  int res;
  int nDist;
  char *pOut;
  char *pR;
  char *pL;
  char *aDoclist;
  int local_e0;
  int nByte;
  int nList;
  int i;
  sqlite3_int64 iMax;
  undefined1 local_c8 [4];
  int bMaxSet;
  TokenDoclist a [4];
  int bDescDoclist;
  u8 bEof;
  Fts3Table *pTab;
  Fts3Doclist *pDL;
  int rc;
  u8 *pbEof_local;
  Fts3Phrase *p_local;
  Fts3Cursor *pCsr_local;
  
  pDL._4_4_ = 0;
  pTab_00 = (Fts3Table *)(pCsr->base).pVtab;
  a[3]._31_1_ = 0;
  if (p->nToken == 1) {
    pDL._4_4_ = sqlite3Fts3MsrIncrNext
                          (pTab_00,p->aToken[0].pSegcsr,&(p->doclist).iDocid,&(p->doclist).pList,
                           &(p->doclist).nList);
    if ((p->doclist).pList == (char *)0x0) {
      a[3]._31_1_ = 1;
    }
  }
  else {
    a[3].nList = (int)pCsr->bDesc;
    memset(local_c8,0,0x80);
    while (a[3]._31_1_ == '\0') {
      iMax._4_4_ = 0;
      _nList = 0;
      nByte = 0;
      while( true ) {
        bVar2 = false;
        if ((pDL._4_4_ == 0) && (bVar2 = false, nByte < p->nToken)) {
          bVar2 = a[3]._31_1_ == '\0';
        }
        if (!bVar2) break;
        pDL._4_4_ = incrPhraseTokenNext(pTab_00,p,nByte,
                                        (TokenDoclist *)(local_c8 + (long)nByte * 0x20),
                                        &a[3].field_0x1f);
        if (*(int *)(local_c8 + (long)nByte * 0x20) == 0) {
          if (iMax._4_4_ != 0) {
            iVar1 = 1;
            if (a[3].nList != 0) {
              iVar1 = -1;
            }
            if (-1 < (long)iVar1 * (_nList - *(long *)(a + nByte))) goto LAB_00202168;
          }
          _nList = *(long *)(a + nByte);
          iMax._4_4_ = 1;
        }
LAB_00202168:
        nByte = nByte + 1;
      }
      for (nByte = 0; nByte < p->nToken; nByte = nByte + 1) {
        while( true ) {
          bVar2 = false;
          if (((pDL._4_4_ == 0) && (bVar2 = false, a[3]._31_1_ == '\0')) &&
             (bVar2 = false, *(int *)(local_c8 + (long)nByte * 0x20) == 0)) {
            iVar1 = 1;
            if (a[3].nList != 0) {
              iVar1 = -1;
            }
            bVar2 = (long)iVar1 * (*(long *)(a + nByte) - _nList) < 0;
          }
          if (!bVar2) break;
          pDL._4_4_ = incrPhraseTokenNext(pTab_00,p,nByte,
                                          (TokenDoclist *)(local_c8 + (long)nByte * 0x20),
                                          &a[3].field_0x1f);
          iVar1 = 1;
          if (a[3].nList != 0) {
            iVar1 = -1;
          }
          if (0 < (long)iVar1 * (*(long *)(a + nByte) - _nList)) {
            _nList = *(long *)(a + nByte);
            nByte = 0;
          }
        }
      }
      if (a[3]._31_1_ == '\0') {
        local_e0 = 0;
        aDoclist._4_4_ = *(int *)&a[p->nToken + -1].pList;
        pL = (char *)sqlite3_malloc(aDoclist._4_4_ + 8);
        if (pL == (char *)0x0) {
          return 7;
        }
        memcpy(pL,(void *)a[p->nToken + -1].iDocid,(long)(aDoclist._4_4_ + 1));
        memset(pL + aDoclist._4_4_,0,8);
        for (nByte = 0; nByte < p->nToken + -1; nByte = nByte + 1) {
          if (*(int *)(local_c8 + (long)nByte * 0x20) == 0) {
            pR = (char *)a[nByte].iDocid;
            pOut = pL;
            _res = pL;
            iVar1 = fts3PoslistPhraseMerge((char **)&res,(p->nToken + -1) - nByte,0,1,&pR,&pOut);
            if (iVar1 == 0) break;
            local_e0 = (int)_res - (int)pL;
          }
        }
        if (nByte == p->nToken + -1) {
          (p->doclist).iDocid = _nList;
          (p->doclist).pList = pL;
          (p->doclist).nList = local_e0;
          (p->doclist).bFreeList = 1;
          break;
        }
        sqlite3_free(pL);
      }
    }
  }
  *pbEof = a[3]._31_1_;
  return pDL._4_4_;
}

Assistant:

static int fts3EvalIncrPhraseNext(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Phrase *p,                  /* Phrase object to advance to next docid */
  u8 *pbEof                       /* OUT: Set to 1 if EOF */
){
  int rc = SQLITE_OK;
  Fts3Doclist *pDL = &p->doclist;
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  u8 bEof = 0;

  /* This is only called if it is guaranteed that the phrase has at least
  ** one incremental token. In which case the bIncr flag is set. */
  assert( p->bIncr==1 );

  if( p->nToken==1 ){
    rc = sqlite3Fts3MsrIncrNext(pTab, p->aToken[0].pSegcsr, 
        &pDL->iDocid, &pDL->pList, &pDL->nList
    );
    if( pDL->pList==0 ) bEof = 1;
  }else{
    int bDescDoclist = pCsr->bDesc;
    struct TokenDoclist a[MAX_INCR_PHRASE_TOKENS];

    memset(a, 0, sizeof(a));
    assert( p->nToken<=MAX_INCR_PHRASE_TOKENS );
    assert( p->iDoclistToken<MAX_INCR_PHRASE_TOKENS );

    while( bEof==0 ){
      int bMaxSet = 0;
      sqlite3_int64 iMax = 0;     /* Largest docid for all iterators */
      int i;                      /* Used to iterate through tokens */

      /* Advance the iterator for each token in the phrase once. */
      for(i=0; rc==SQLITE_OK && i<p->nToken && bEof==0; i++){
        rc = incrPhraseTokenNext(pTab, p, i, &a[i], &bEof);
        if( a[i].bIgnore==0 && (bMaxSet==0 || DOCID_CMP(iMax, a[i].iDocid)<0) ){
          iMax = a[i].iDocid;
          bMaxSet = 1;
        }
      }
      assert( rc!=SQLITE_OK || (p->nToken>=1 && a[p->nToken-1].bIgnore==0) );
      assert( rc!=SQLITE_OK || bMaxSet );

      /* Keep advancing iterators until they all point to the same document */
      for(i=0; i<p->nToken; i++){
        while( rc==SQLITE_OK && bEof==0 
            && a[i].bIgnore==0 && DOCID_CMP(a[i].iDocid, iMax)<0 
        ){
          rc = incrPhraseTokenNext(pTab, p, i, &a[i], &bEof);
          if( DOCID_CMP(a[i].iDocid, iMax)>0 ){
            iMax = a[i].iDocid;
            i = 0;
          }
        }
      }

      /* Check if the current entries really are a phrase match */
      if( bEof==0 ){
        int nList = 0;
        int nByte = a[p->nToken-1].nList;
        char *aDoclist = sqlite3_malloc(nByte+FTS3_BUFFER_PADDING);
        if( !aDoclist ) return SQLITE_NOMEM;
        memcpy(aDoclist, a[p->nToken-1].pList, nByte+1);
        memset(&aDoclist[nByte], 0, FTS3_BUFFER_PADDING);

        for(i=0; i<(p->nToken-1); i++){
          if( a[i].bIgnore==0 ){
            char *pL = a[i].pList;
            char *pR = aDoclist;
            char *pOut = aDoclist;
            int nDist = p->nToken-1-i;
            int res = fts3PoslistPhraseMerge(&pOut, nDist, 0, 1, &pL, &pR);
            if( res==0 ) break;
            nList = (int)(pOut - aDoclist);
          }
        }
        if( i==(p->nToken-1) ){
          pDL->iDocid = iMax;
          pDL->pList = aDoclist;
          pDL->nList = nList;
          pDL->bFreeList = 1;
          break;
        }
        sqlite3_free(aDoclist);
      }
    }
  }

  *pbEof = bEof;
  return rc;
}